

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagColormap(TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir)

{
  uint uVar1;
  uint16_t *value;
  int o;
  uint16_t *n;
  uint32_t m;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    tif_local._4_4_ = 1;
  }
  else {
    uVar1 = 1 << ((byte)(tif->tif_dir).td_bitspersample & 0x1f);
    value = (uint16_t *)_TIFFmallocExt(tif,(ulong)(uVar1 * 3) << 1);
    if (value == (uint16_t *)0x0) {
      TIFFErrorExtR(tif,"TIFFWriteDirectoryTagColormap","Out of memory");
      tif_local._4_4_ = 0;
    }
    else {
      _TIFFmemcpy(value,(tif->tif_dir).td_colormap[0],(ulong)uVar1 << 1);
      _TIFFmemcpy(value + uVar1,(tif->tif_dir).td_colormap[1],(ulong)uVar1 << 1);
      _TIFFmemcpy(value + (uVar1 << 1),(tif->tif_dir).td_colormap[2],(ulong)uVar1 << 1);
      tif_local._4_4_ = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,0x140,uVar1 * 3,value);
      _TIFFfreeExt(tif,value);
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagColormap(TIFF *tif, uint32_t *ndir,
                                         TIFFDirEntry *dir)
{
    static const char module[] = "TIFFWriteDirectoryTagColormap";
    uint32_t m;
    uint16_t *n;
    int o;
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    m = (1 << tif->tif_dir.td_bitspersample);
    n = _TIFFmallocExt(tif, 3 * m * sizeof(uint16_t));
    if (n == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }
    _TIFFmemcpy(&n[0], tif->tif_dir.td_colormap[0], m * sizeof(uint16_t));
    _TIFFmemcpy(&n[m], tif->tif_dir.td_colormap[1], m * sizeof(uint16_t));
    _TIFFmemcpy(&n[2 * m], tif->tif_dir.td_colormap[2], m * sizeof(uint16_t));
    o = TIFFWriteDirectoryTagCheckedShortArray(tif, ndir, dir, TIFFTAG_COLORMAP,
                                               3 * m, n);
    _TIFFfreeExt(tif, n);
    return (o);
}